

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O2

void tt_apply_mvar(TT_Face face)

{
  short sVar1;
  undefined2 uVar2;
  GX_Blend pGVar3;
  GX_MVarTable pGVar4;
  FT_ULong FVar5;
  FT_ItemVarDelta FVar6;
  FT_Short *pFVar7;
  GX_Value pGVar8;
  short sVar9;
  short sVar10;
  FT_ItemVarDelta FVar11;
  FT_ItemVarDelta FVar12;
  GX_Value pGVar13;
  undefined8 local_38;
  
  if ((face->variation_support & 0x100) != 0) {
    pGVar3 = face->blend;
    pGVar4 = pGVar3->mvar_table;
    pGVar13 = pGVar4->values;
    if (pGVar13 == (GX_Value)0x0) {
      pGVar8 = (GX_Value)0x0;
    }
    else {
      pGVar8 = pGVar13 + pGVar4->valueCount;
    }
    local_38 = 0;
    FVar11 = 0;
    while( true ) {
      if (pGVar8 <= pGVar13) break;
      pFVar7 = ft_var_get_value_pointer(face,pGVar13->tag);
      FVar6 = tt_var_get_item_delta
                        (face,&pGVar3->mvar_table->itemStore,(uint)pGVar13->outerIndex,
                         (uint)pGVar13->innerIndex);
      FVar12 = FVar11;
      if ((pFVar7 != (FT_Short *)0x0) && (FVar6 != 0)) {
        *pFVar7 = pGVar13->unmodified + (short)FVar6;
        FVar5 = pGVar13->tag;
        FVar12 = FVar6;
        if (FVar5 != 0x68617363) {
          if (FVar5 == 0x686c6770) {
            local_38 = CONCAT44(FVar6,(undefined4)local_38);
            FVar12 = FVar11;
          }
          else {
            FVar12 = FVar11;
            if (FVar5 == 0x68647363) {
              local_38 = CONCAT44(local_38._4_4_,FVar6);
            }
          }
        }
      }
      pGVar13 = pGVar13 + 1;
      FVar11 = FVar12;
    }
    sVar1 = (face->root).ascender;
    uVar2 = (face->root).descender;
    sVar10 = (short)FVar11 + sVar1;
    (face->root).ascender = sVar10;
    sVar9 = (short)local_38 + uVar2;
    (face->root).descender = sVar9;
    (face->root).height =
         (sVar10 + uVar2 + (((short)((ulong)local_38 >> 0x20) + (face->root).height) - sVar1)) -
         sVar9;
    sVar1 = (face->postscript).underlineThickness;
    (face->root).underline_position = sVar1 / -2 + (face->postscript).underlinePosition;
    (face->root).underline_thickness = sVar1;
    FT_List_Iterate(&(face->root).sizes_list,tt_size_reset_iterator,(void *)0x0);
    return;
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  tt_apply_mvar( TT_Face  face )
  {
    GX_Blend  blend = face->blend;
    GX_Value  value, limit;
    FT_Short  mvar_hasc_delta = 0;
    FT_Short  mvar_hdsc_delta = 0;
    FT_Short  mvar_hlgp_delta = 0;


    if ( !( face->variation_support & TT_FACE_FLAG_VAR_MVAR ) )
      return;

    value = blend->mvar_table->values;
    limit = FT_OFFSET( value, blend->mvar_table->valueCount );

    for ( ; value < limit; value++ )
    {
      FT_Short*  p = ft_var_get_value_pointer( face, value->tag );
      FT_Int     delta;


      delta = tt_var_get_item_delta( face,
                                     &blend->mvar_table->itemStore,
                                     value->outerIndex,
                                     value->innerIndex );

      if ( p && delta )
      {
        FT_TRACE5(( "value %c%c%c%c (%d unit%s) adjusted by %d unit%s (MVAR)\n",
                    (FT_Char)( value->tag >> 24 ),
                    (FT_Char)( value->tag >> 16 ),
                    (FT_Char)( value->tag >> 8 ),
                    (FT_Char)( value->tag ),
                    value->unmodified,
                    value->unmodified == 1 ? "" : "s",
                    delta,
                    delta == 1 ? "" : "s" ));

        /* since we handle both signed and unsigned values as FT_Short, */
        /* ensure proper overflow arithmetic                            */
        *p = (FT_Short)( value->unmodified + (FT_Short)delta );

        /* Treat hasc, hdsc and hlgp specially, see below. */
        if ( value->tag == MVAR_TAG_HASC )
          mvar_hasc_delta = (FT_Short)delta;
        else if ( value->tag == MVAR_TAG_HDSC )
          mvar_hdsc_delta = (FT_Short)delta;
        else if ( value->tag == MVAR_TAG_HLGP )
          mvar_hlgp_delta = (FT_Short)delta;
      }
    }

    /* adjust all derived values */
    {
      FT_Face  root = &face->root;

      /*
       * Apply the deltas of hasc, hdsc and hlgp to the FT_Face's ascender,
       * descender and height attributes, no matter how they were originally
       * computed.
       *
       * (Code that ignores those and accesses the font's metrics values
       * directly is already served by the delta application code above.)
       *
       * The MVAR table supports variations for both typo and win metrics.
       * According to Behdad Esfahbod, the thinking of the working group was
       * that no one uses win metrics anymore for setting line metrics (the
       * specification even calls these metrics "horizontal clipping
       * ascent/descent", probably for their role on the Windows platform in
       * computing clipping boxes), and new fonts should use typo metrics, so
       * typo deltas should be applied to whatever sfnt_load_face decided the
       * line metrics should be.
       *
       * Before, the following led to different line metrics between default
       * outline and instances, visible when e.g. the default outlines were
       * used as the regular face and instances for everything else:
       *
       * 1. sfnt_load_face applied the hhea metrics by default.
       * 2. This code later applied the typo metrics by default, regardless of
       *    whether they were actually changed or the font had the OS/2 table's
       *    fsSelection's bit 7 (USE_TYPO_METRICS) set.
       */
      FT_Short  current_line_gap = root->height - root->ascender +
                                   root->descender;


      root->ascender  = root->ascender + mvar_hasc_delta;
      root->descender = root->descender + mvar_hdsc_delta;
      root->height    = root->ascender - root->descender +
                        current_line_gap + mvar_hlgp_delta;

      root->underline_position  = face->postscript.underlinePosition -
                                  face->postscript.underlineThickness / 2;
      root->underline_thickness = face->postscript.underlineThickness;

      /* iterate over all FT_Size objects and call `tt_size_reset' */
      /* to propagate the metrics changes                          */
      FT_List_Iterate( &root->sizes_list,
                       tt_size_reset_iterator,
                       NULL );
    }
  }